

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O3

acmod_id_t acmod_set_name2id(acmod_set_t *acmod_set,char *name)

{
  uint uVar1;
  int iVar2;
  acmod_id_t aVar3;
  acmod_id_t left_context;
  acmod_id_t right_context;
  cell_index_t cVar4;
  long lVar5;
  char *pcVar6;
  ci_acmod_t *pcVar7;
  ulong uVar8;
  int n_scan;
  char posn [12];
  char base [1024];
  char right [1024];
  char left [1024];
  char tmp_store [1024];
  int local_1038;
  char local_1034 [12];
  char local_1028 [1024];
  char local_c28 [1024];
  char local_828 [1024];
  char local_428 [1024];
  
  strcpy(local_428,name);
  iVar2 = __isoc99_sscanf(local_428,"%s%n",local_1028,&local_1038);
  if (iVar2 == 1) {
    pcVar6 = local_428 + local_1038;
    iVar2 = __isoc99_sscanf(pcVar6,"%s%n",local_828);
    if (iVar2 != 1) {
      uVar1 = acmod_set->n_ci;
      if ((ulong)uVar1 == 0) {
        return 0xffffffff;
      }
      pcVar7 = acmod_set->ci;
      uVar8 = 0;
      do {
        iVar2 = strcmp(pcVar7->name,local_1028);
        if (iVar2 == 0) {
          return (acmod_id_t)uVar8;
        }
        uVar8 = uVar8 + 1;
        pcVar7 = pcVar7 + 1;
      } while (uVar1 != uVar8);
      return 0xffffffff;
    }
    lVar5 = (long)local_1038;
    iVar2 = __isoc99_sscanf(pcVar6 + lVar5,"%s%n",local_c28);
    if (iVar2 == 1) {
      iVar2 = __isoc99_sscanf(pcVar6 + lVar5 + local_1038,"%s%n",local_1034);
      if (iVar2 == 1) {
        aVar3 = acmod_set_name2id(acmod_set,local_1028);
        left_context = acmod_set_name2id(acmod_set,local_828);
        right_context = acmod_set_name2id(acmod_set,local_c28);
        lVar5 = 0;
        do {
          if (local_1034[0] == "besiu"[lVar5]) {
            if (acmod_set->n_multi == 0) {
              return 0xffffffff;
            }
            cVar4 = itree_find_tri(acmod_set->multi_idx[aVar3],left_context,right_context,
                                   (cell_id_t)lVar5);
            return cVar4;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 5);
        pcVar6 = "Unknown word position identifier %s\n";
        name = local_1034;
        lVar5 = 0x1ea;
      }
      else {
        pcVar6 = "Parse error while getting word position of %s\n";
        lVar5 = 0x1db;
      }
    }
    else {
      pcVar6 = "Parse error while getting right context of %s\n";
      lVar5 = 0x1d2;
    }
  }
  else {
    pcVar6 = "Error parsing acoustic model name %s\n";
    lVar5 = 0x1be;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
          ,lVar5,pcVar6,name);
  return 0xffffffff;
}

Assistant:

acmod_id_t
acmod_set_name2id(acmod_set_t *acmod_set,
		  const char *name)
{
    uint32 i;
    char tmp_store[1024];
    char *tmp;
    int n_scan;
    int n_assign;
    char base[1024];
    acmod_id_t base_id;

    char left[1024];
    acmod_id_t left_id;

    char right[1024];
    acmod_id_t right_id;

    char *word_posn_map = WORD_POSN_CHAR_MAP;
    char posn[12];
    uint32 posn_id;

    strcpy(tmp_store, name);

    tmp = tmp_store;

    n_assign = sscanf(tmp, "%s%n", base, &n_scan);
    tmp += n_scan;

    if (n_assign != 1) {
	E_ERROR("Error parsing acoustic model name %s\n", name);
	return NO_ACMOD;
    }

    n_assign = sscanf(tmp, "%s%n", left, &n_scan);
    tmp += n_scan;
    
    if (n_assign != 1) {
	for (i = 0; i < acmod_set->n_ci; i++) {
	    if (strcmp(acmod_set->ci[i].name, base) == 0)
		return i;
	}
    
	return NO_ACMOD;
    }
    else {
	n_assign = sscanf(tmp, "%s%n", right, &n_scan);
	tmp += n_scan;
    
	if (n_assign != 1) {
	    E_ERROR("Parse error while getting right context of %s\n", name);

	    return NO_ACMOD;
	}

	n_assign = sscanf(tmp, "%s%n", posn, &n_scan);
	tmp += n_scan;
    
	if (n_assign != 1) {
	    E_ERROR("Parse error while getting word position of %s\n", name);
	    
	    return NO_ACMOD;
	}

	base_id  = acmod_set_name2id(acmod_set, base);
	left_id  = acmod_set_name2id(acmod_set, left);
	right_id = acmod_set_name2id(acmod_set, right);

	for (posn_id = 0; posn_id < strlen(word_posn_map); posn_id++) {
	    if (posn[0] == word_posn_map[(uint32)posn_id])
		break;
	}

	if (posn_id == strlen(word_posn_map)) {
	    E_ERROR("Unknown word position identifier %s\n", posn);

	    return NO_ACMOD;
	}
	
	return acmod_set_tri2id(acmod_set, base_id, left_id, right_id, (word_posn_t)posn_id);
    }
    
    return NO_ACMOD;
}